

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpState)

{
  size_t sVar1;
  char *pcVar2;
  string *psVar3;
  string fullName;
  ostringstream name;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  string local_1d0;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"fail_",5);
  if ((ulong)*(uint *)this < 8) {
    pcVar2 = *(char **)(&DAT_00cf4960 + (ulong)*(uint *)this * 8);
    sVar1 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar1);
  }
  else {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_pass_",6);
  if ((ulong)*(uint *)(this + 4) < 8) {
    pcVar2 = *(char **)(&DAT_00cf4960 + (ulong)*(uint *)(this + 4) * 8);
    sVar1 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar1);
  }
  else {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_dfail_",7);
  if ((ulong)*(uint *)(this + 8) < 8) {
    pcVar2 = *(char **)(&DAT_00cf4960 + (ulong)*(uint *)(this + 8) * 8);
    sVar1 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,sVar1);
  }
  else {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_comp_",6);
  pcVar2 = ::vk::getCompareOpName(*(VkCompareOp *)(this + 0xc));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar2,(allocator<char> *)&local_1d0);
  std::__cxx11::string::substr((ulong)&local_1d0,(ulong)local_1b0);
  de::toLower(&local_1f0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar3 = (string *)std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string getStencilName(const VkStencilOpState& stencilOpState)
{
	std::ostringstream name;

	name << "fail_" << getShortName(stencilOpState.failOp)
		 << "_pass_" << getShortName(stencilOpState.passOp)
		 << "_dfail_" << getShortName(stencilOpState.depthFailOp)
		 << "_comp_" << getShortName(stencilOpState.compareOp);

	return name.str();
}